

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

OperatorInformation * __thiscall
duckdb::OperatorProfiler::GetOperatorInfo(OperatorProfiler *this,PhysicalOperator *phys_op)

{
  iterator iVar1;
  OperatorInformation *pOVar2;
  mapped_type *this_00;
  reference_map_t<const_PhysicalOperator,_OperatorInformation> *this_01;
  key_type local_b8;
  undefined1 local_b0 [32];
  double local_90;
  idx_t iStack_88;
  idx_t local_80;
  idx_t iStack_78;
  idx_t local_70;
  pointer ppStack_68;
  pointer local_60;
  pointer ppStack_58;
  __node_base_ptr *local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  float local_30;
  size_t local_28;
  __node_base_ptr p_Stack_20;
  
  this_01 = &this->operator_infos;
  local_b0._0_8_ = phys_op;
  iVar1 = ::std::
          _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_01->_M_h,(key_type *)local_b0);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_b0._0_8_ = local_b0 + 0x10;
    local_b0._8_8_ = 0;
    local_b0[0x10] = '\0';
    local_50 = &p_Stack_20;
    local_90 = 0.0;
    iStack_88 = 0;
    local_80 = 0;
    iStack_78 = 0;
    local_70 = 0;
    ppStack_68 = (pointer)0x0;
    local_60 = (pointer)0x0;
    ppStack_58 = (pointer)0x0;
    local_48 = 1;
    local_40._M_nxt = (_Hash_node_base *)0x0;
    sStack_38 = 0;
    local_30 = 1.0;
    local_28 = 0;
    p_Stack_20 = (__node_base_ptr)0x0;
    local_b8._M_data = phys_op;
    this_00 = ::std::__detail::
              _Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,&local_b8);
    OperatorInformation::operator=(this_00,(OperatorInformation *)local_b0);
    OperatorInformation::~OperatorInformation((OperatorInformation *)local_b0);
    local_b0._0_8_ = phys_op;
    pOVar2 = ::std::__detail::
             _Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)local_b0);
  }
  else {
    pOVar2 = (OperatorInformation *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_duckdb::OperatorInformation>,_true>
                    ._M_cur + 0x10);
  }
  return pOVar2;
}

Assistant:

OperatorInformation &OperatorProfiler::GetOperatorInfo(const PhysicalOperator &phys_op) {
	auto entry = operator_infos.find(phys_op);
	if (entry != operator_infos.end()) {
		return entry->second;
	}

	// Add a new entry.
	operator_infos[phys_op] = OperatorInformation();
	return operator_infos[phys_op];
}